

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameData.cpp
# Opt level: O0

void __thiscall GameData::InitNewGame(GameData *this)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  int *piVar3;
  istream local_220 [8];
  ifstream TempFile;
  int local_18;
  int local_14;
  int j;
  int i;
  GameData *this_local;
  
  piVar3 = std::max<int>(&this->local_best,&this->score);
  this->local_best = *piVar3;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      this->num[local_14][local_18] = 0;
    }
  }
  MakeNewNumber(this);
  MakeNewNumber(this);
  _Var2 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(local_220,"2048GAME.data",_Var2);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::istream::operator>>(local_220,&this->my_best);
  }
  std::ifstream::close();
  this->score = 0;
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void GameData::InitNewGame() {
    local_best = std::max(local_best, score);
    for (int i = 0; i < 4; i++)
        for (int j = 0; j < 4; j++)
            num[i][j] = 0;
    MakeNewNumber();
    MakeNewNumber();
    std::ifstream TempFile("2048GAME.data",std::ios::in | std::ios::binary);
    if(TempFile.is_open())
        TempFile>>my_best;
    TempFile.close();
    score = 0;
}